

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cpp
# Opt level: O2

void __thiscall
clickhouse::ColumnTuple::ColumnTuple
          (ColumnTuple *this,
          vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
          *columns)

{
  pointer psVar1;
  pointer psVar2;
  vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
  local_68;
  Type local_50;
  __shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_68.
  super__Vector_base<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = (columns->
           super__Vector_base<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (columns->
                super__Vector_base<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               &(((psVar2->super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>);
    std::vector<std::shared_ptr<clickhouse::Type>,std::allocator<std::shared_ptr<clickhouse::Type>>>
    ::emplace_back<std::shared_ptr<clickhouse::Type>>
              ((vector<std::shared_ptr<clickhouse::Type>,std::allocator<std::shared_ptr<clickhouse::Type>>>
                *)&local_68,(shared_ptr<clickhouse::Type> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  Type::CreateTuple(&local_50,&local_68);
  Column::Column(&this->super_Column,(TypeRef *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.field_1);
  std::
  vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>::
  ~vector(&local_68);
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnTuple_00186878;
  std::
  vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
  ::vector(&this->columns_,columns);
  return;
}

Assistant:

ColumnTuple::ColumnTuple(const std::vector<ColumnRef>& columns)
    : Column(Type::CreateTuple(CollectTypes(columns)))
    , columns_(columns)
{
}